

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::read_from_file(image_u8 *dest,char *pFilename,uint read_flags)

{
  uint uVar1;
  uint in_EDX;
  char *in_RSI;
  data_stream_serializer serializer;
  cfile_stream file_stream;
  cfile_stream *this;
  data_stream_serializer local_80;
  undefined4 local_70;
  uint in_stack_ffffffffffffff9c;
  data_stream_serializer *in_stack_ffffffffffffffa0;
  image_u8 *in_stack_ffffffffffffffa8;
  bool local_1;
  
  if (in_EDX < 2) {
    this = (cfile_stream *)&stack0xffffffffffffffa0;
    cfile_stream::cfile_stream(this);
    uVar1 = cfile_stream::open(this,in_RSI,5,0);
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      data_stream_serializer::data_stream_serializer
                (&local_80,(data_stream *)&stack0xffffffffffffffa0);
      local_1 = read_from_stream(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                 in_stack_ffffffffffffff9c);
    }
    local_70 = 1;
    cfile_stream::~cfile_stream(this);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool read_from_file(image_u8& dest, const char* pFilename, uint read_flags) {
  if (read_flags > cReadFlagsAllFlags) {
    CRNLIB_ASSERT(0);
    return false;
  }

  cfile_stream file_stream;
  if (!file_stream.open(pFilename))
    return false;

  data_stream_serializer serializer(file_stream);
  return read_from_stream(dest, serializer, read_flags);
}